

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsplitter.cpp
# Opt level: O0

void QSplitter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Orientation *pOVar1;
  bool bVar2;
  Orientation OVar3;
  QSplitter *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QSplitter *in_RDI;
  void *_v_1;
  void *_v;
  QSplitter *_t;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QSplitter *in_stack_ffffffffffffffb0;
  QSplitter *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd8;
  Orientation orientation;
  
  orientation = (Orientation)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if ((in_ESI == 0) && (in_EDX == 0)) {
    splitterMoved((QSplitter *)0x69e085,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  if (in_ESI == 5) {
    orientation = 0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QSplitter::*)(int,int)>
                      (in_RCX,(void **)splitterMoved,0,0);
    if (bVar2) {
      return;
    }
  }
  if (in_ESI == 1) {
    pOVar1 = *(Orientation **)in_RCX;
    switch((QSplitter *)(ulong)in_EDX) {
    case (QSplitter *)0x0:
      OVar3 = QSplitter::orientation(in_stack_ffffffffffffffb0);
      *pOVar1 = OVar3;
      break;
    case (QSplitter *)0x1:
      bVar2 = opaqueResize(in_stack_ffffffffffffffc0);
      *(bool *)pOVar1 = bVar2;
      break;
    case (QSplitter *)0x2:
      OVar3 = handleWidth((QSplitter *)(ulong)in_EDX);
      *pOVar1 = OVar3;
      break;
    case (QSplitter *)0x3:
      bVar2 = childrenCollapsible(in_stack_ffffffffffffffb0);
      *(bool *)pOVar1 = bVar2;
    }
  }
  if (in_ESI == 2) {
    this = (QSplitter *)(ulong)in_EDX;
    bVar2 = SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0);
    switch(this) {
    case (QSplitter *)0x0:
      setOrientation(in_RDI,orientation);
      break;
    case (QSplitter *)0x1:
      setOpaqueResize(this,bVar2);
      break;
    case (QSplitter *)0x2:
      setHandleWidth(this,in_stack_ffffffffffffffac);
      break;
    case (QSplitter *)0x3:
      setChildrenCollapsible(this,bVar2);
    }
  }
  return;
}

Assistant:

void QSplitter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSplitter *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->splitterMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSplitter::*)(int , int )>(_a, &QSplitter::splitterMoved, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->opaqueResize(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->handleWidth(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->childrenCollapsible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 1: _t->setOpaqueResize(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setHandleWidth(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setChildrenCollapsible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}